

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_crypto.c
# Opt level: O3

void test_archive_md5(void)

{
  int iVar1;
  uchar buf [1];
  archive_md5_ctx ctx;
  uchar actualmd [17];
  uchar md [16];
  undefined1 local_6a;
  archive_md5_ctx local_69;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 local_58;
  undefined1 local_48 [24];
  
  local_6a = 0;
  local_68 = 0xad85b893;
  uStack_64 = 0x89a00dfe;
  uStack_60 = 0x9034f6cd;
  uStack_5c = 0x719fd54f;
  local_58 = 0;
  iVar1 = __archive_stub_md5init(&local_69);
  if (iVar1 == 0) {
    iVar1 = __archive_stub_md5update(&local_69,&local_6a,1);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_crypto.c"
                        ,L'-',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_md5_update(&ctx, buf, sizeof(buf))",(void *)0x0);
    iVar1 = __archive_stub_md5final(&local_69,local_48);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_crypto.c"
                        ,L'.',0,"ARCHIVE_OK",(long)iVar1,"archive_md5_final(&ctx, md)",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_crypto.c"
                        ,L'/',local_48,"md",&local_68,"actualmd",0x10,"sizeof(md)",(void *)0x0);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_crypto.c"
                   ,L'*');
    test_skipping("This platform does not support MD5");
  }
  return;
}

Assistant:

DEFINE_TEST(test_archive_md5)
{
	archive_md5_ctx ctx;
	unsigned char buf[] = "";
	unsigned char md[16];
	unsigned char actualmd[] = "\x93\xb8\x85\xad\xfe\x0d\xa0\x89"
                             "\xcd\xf6\x34\x90\x4f\xd5\x9f\x71";

	if (ARCHIVE_OK != archive_md5_init(&ctx)) {
		skipping("This platform does not support MD5");
		return;
	}
	assertEqualInt(ARCHIVE_OK, archive_md5_update(&ctx, buf, sizeof(buf)));
	assertEqualInt(ARCHIVE_OK, archive_md5_final(&ctx, md));
	assertEqualMem(md, actualmd, sizeof(md));
}